

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O3

void evutil_secure_rng_get_bytes(void *buf,size_t n)

{
  uchar uVar1;
  uchar uVar2;
  __pid_t _Var3;
  int iVar4;
  byte bVar5;
  
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,arc4rand_lock);
  }
  _Var3 = getpid();
  if (((arc4_count < 1) || ((rs_initialized & 1) == 0)) || (arc4_stir_pid != _Var3)) {
    arc4_stir_pid = _Var3;
    arc4_stir();
  }
  iVar4 = arc4_count;
  if (n != 0) {
    do {
      arc4_count = iVar4 + -1;
      if (iVar4 < 2) {
        arc4_stir();
      }
      iVar4 = arc4_count;
      rs.i = rs.i + 1;
      uVar1 = rs.s[rs.i];
      bVar5 = rs.j + uVar1;
      uVar2 = rs.s[bVar5];
      rs.j = bVar5;
      rs.s[rs.i] = uVar2;
      rs.s[bVar5] = uVar1;
      *(uchar *)((long)buf + (n - 1)) = rs.s[(byte)(uVar2 + uVar1)];
      n = n - 1;
    } while (n != 0);
  }
  if (arc4rand_lock == (void *)0x0) {
    return;
  }
  (*evthread_lock_fns_.unlock)(0,arc4rand_lock);
  return;
}

Assistant:

void
evutil_secure_rng_get_bytes(void *buf, size_t n)
{
	ev_arc4random_buf(buf, n);
}